

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::detail::Do_Call<std::shared_ptr<unsigned_short>>::
go<std::shared_ptr<unsigned_short>(chaiscript::Boxed_Number_const&),chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<unsigned_short>,chaiscript::Boxed_Number_const&>>
          (Do_Call<std::shared_ptr<unsigned_short>> *this,
          Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&> *fun,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  undefined1 local_21;
  shared_ptr<unsigned_short> local_20;
  
  call_func<chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<unsigned_short>,chaiscript::Boxed_Number_const&>,std::shared_ptr<unsigned_short>,chaiscript::Boxed_Number_const&,0ul>
            (&local_20,&local_21,fun,params,t_conversions);
  Handle_Return<std::shared_ptr<unsigned_short>_>::handle
            ((Handle_Return<std::shared_ptr<unsigned_short>_> *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value go(const Callable &fun, const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
          {
            return Handle_Return<Ret>::handle(call_func(Function_Signature<Signature>(), fun, params, t_conversions));
          }